

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  vector<unsigned_short> *remapping;
  ushort uVar1;
  uint16 i;
  uint uVar2;
  ulong uVar3;
  uint16 selected_index;
  uint uVar4;
  ulong uVar5;
  uint16 i_2;
  uint uVar6;
  uint16 i_3;
  uint uVar7;
  ulong uVar8;
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  uint8 D4 [256];
  uint8 D8 [65536];
  elemental_vector eStack_10168;
  elemental_vector eStack_10158;
  crn_comp *pcStack_10148;
  ulong uStack_10140;
  char acStack_10138 [256];
  byte abStack_10038 [65544];
  
  remapping = this->m_selector_remaping;
  uVar1 = (ushort)(this->m_color_selectors).m_size;
  uVar2 = this->m_selector_remaping[0].m_size;
  uVar4 = (uint)uVar1;
  uVar7 = (uint)uVar1;
  if (uVar2 != uVar1) {
    if (uVar2 <= uVar1) {
      if (this->m_selector_remaping[0].m_capacity < uVar4) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar7,uVar2 + 1 == uVar4,2,(object_mover)0x0,false)
        ;
        uVar2 = this->m_selector_remaping[0].m_size;
      }
      memset(remapping->m_p + uVar2,0,(ulong)(uVar7 - uVar2) * 2);
    }
    this->m_selector_remaping[0].m_size = (uint)uVar1;
  }
  uVar3 = 0;
  do {
    acStack_10138[uVar3] =
         (&DAT_001b75e0)[(uint)(uVar3 >> 2) & 3 ^ (uint)(uVar3 >> 6) & 0x3ffffff] +
         (&DAT_001b75e0)[((uint)(uVar3 >> 4) & 0xfffffff ^ (uint)uVar3) & 3];
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  uVar3 = 0;
  do {
    uVar2 = (uint)(uVar3 >> 4);
    abStack_10038[uVar3] =
         acStack_10138[(uint)uVar3 & 0xf | uVar2 & 0xf0] +
         acStack_10138[uVar2 & 0xf | (uint)(uVar3 >> 8) & 0xf0];
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x10000);
  eStack_10158.m_p = (void *)0x0;
  eStack_10158.m_size = 0;
  eStack_10158.m_capacity = 0;
  if (uVar1 == 0) {
    eStack_10168.m_p = (void *)0x0;
    eStack_10168.m_size = 0;
    eStack_10168.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity(&eStack_10158,uVar4,uVar4 == 1,4,(object_mover)0x0,false);
    memset((void *)((eStack_10158._8_8_ & 0xffffffff) * 4 + (long)eStack_10158.m_p),0,
           (ulong)(uVar4 - eStack_10158.m_size) << 2);
    eStack_10158.m_size = uVar4;
    eStack_10168.m_p = (void *)0x0;
    eStack_10168.m_size = 0;
    eStack_10168.m_capacity = 0;
    elemental_vector::increase_capacity(&eStack_10168,uVar4,uVar4 == 1,2,(object_mover)0x0,false);
    uVar3 = 0;
    memset((void *)((eStack_10168._8_8_ & 0xffffffff) * 2 + (long)eStack_10168.m_p),0,
           (ulong)(uVar4 - eStack_10168.m_size) * 2);
    eStack_10168.m_size = uVar4;
    do {
      *(uint *)((long)eStack_10158.m_p + uVar3 * 4) = (this->m_color_selectors).m_p[uVar3];
      *(short *)((long)eStack_10168.m_p + uVar3 * 2) = (short)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (uVar4 != 0) {
    uStack_10140 = (ulong)uVar7;
    uVar2 = 0;
    uVar3 = uStack_10140;
    do {
      uVar7 = 0xffffffff;
      uVar8 = 0;
      uVar4 = 0;
      do {
        uVar6 = *(uint *)((long)eStack_10158.m_p + uVar8 * 4);
        uVar6 = (uint)abStack_10038[(uVar6 & 0xff) << 8 | uVar2 & 0xff] +
                (uint)abStack_10038[uVar6 & 0xff00 | uVar2 >> 8 & 0xff] +
                (uint)abStack_10038[uVar6 >> 8 & 0xff00 | uVar2 >> 0x10 & 0xff] +
                (uint)abStack_10038[uVar6 >> 0x10 & 0xff00 | uVar2 >> 0x18];
        if (uVar6 < uVar7) {
          uVar7 = uVar6;
          uVar4 = (uint)uVar8;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar3);
      uVar5 = (ulong)((uVar4 & 0xffff) * 4);
      uVar2 = *(uint *)((long)eStack_10158.m_p + uVar5);
      uVar8 = (ulong)((uVar4 & 0xffff) * 2);
      remapping->m_p[*(ushort *)((long)eStack_10168.m_p + uVar8)] = uVar1 - (short)uVar3;
      *(undefined4 *)((long)eStack_10158.m_p + uVar5) =
           *(undefined4 *)((long)eStack_10158.m_p + uVar3 * 4 + -4);
      *(undefined2 *)((long)eStack_10168.m_p + uVar8) =
           *(undefined2 *)((long)eStack_10168.m_p + uVar3 * 2 + -2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  pcStack_10148 = this;
  pack_color_selectors(this,&this->m_packed_color_selectors,remapping);
  if (eStack_10168.m_p != (void *)0x0) {
    crnlib_free(eStack_10168.m_p);
  }
  if (eStack_10158.m_p != (void *)0x0) {
    crnlib_free(eStack_10158.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
  uint16 n = m_color_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 5, 14, 10};

  uint8 D4[0x100];
  for (uint16 i = 0; i < 0x100; i++)
    D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
  uint8 D8[0x10000];
  for (uint32 i = 0; i < 0x10000; i++)
    D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];

  crnlib::vector<uint32> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_color_selectors[i];
    indices[i] = i;
  }
  uint32 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint32 selector = selectors[i];
      uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
      uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
      uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
      uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
      uint error = d0 + d1 + d2 + d3;
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_color_selectors(m_packed_color_selectors, remapping);
}